

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3OsCurrentTimeInt64(sqlite3_vfs *pVfs,sqlite3_int64 *pTimeOut)

{
  int iVar1;
  long in_FS_OFFSET;
  double r;
  double local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((pVfs->iVersion < 2) ||
     (pVfs->xCurrentTimeInt64 == (_func_int_sqlite3_vfs_ptr_sqlite3_int64_ptr *)0x0)) {
    local_20 = -NAN;
    iVar1 = (*pVfs->xCurrentTime)(pVfs,&local_20);
    *pTimeOut = (long)(local_20 * 86400000.0);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return iVar1;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    iVar1 = (*pVfs->xCurrentTimeInt64)(pVfs,pTimeOut);
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE int sqlite3OsCurrentTimeInt64(sqlite3_vfs *pVfs, sqlite3_int64 *pTimeOut){
  int rc;
  /* IMPLEMENTATION-OF: R-49045-42493 SQLite will use the xCurrentTimeInt64()
  ** method to get the current date and time if that method is available
  ** (if iVersion is 2 or greater and the function pointer is not NULL) and
  ** will fall back to xCurrentTime() if xCurrentTimeInt64() is
  ** unavailable.
  */
  if( pVfs->iVersion>=2 && pVfs->xCurrentTimeInt64 ){
    rc = pVfs->xCurrentTimeInt64(pVfs, pTimeOut);
  }else{
    double r;
    rc = pVfs->xCurrentTime(pVfs, &r);
    *pTimeOut = (sqlite3_int64)(r*86400000.0);
  }
  return rc;
}